

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  ResScalar *res;
  RhsScalar *pRVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 blockA_00;
  long *plVar7;
  ulong size_00;
  ulong size_01;
  ulong size_02;
  LhsScalar *pLVar8;
  double **ppdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  double *local_358 [4];
  double *local_338;
  double *local_330;
  double *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  ulong *local_2e0;
  ulong local_2d8;
  double *local_2d0;
  RhsScalar *local_2c8;
  RhsScalar *local_2c0;
  RhsScalar *local_2b8;
  RhsScalar *local_2b0;
  RhsScalar *local_2a8;
  RhsScalar *local_2a0;
  double *local_298;
  RhsScalar *local_290;
  RhsScalar *local_288;
  RhsScalar *local_280;
  RhsScalar *local_278;
  RhsScalar *local_270;
  RhsScalar *local_268;
  double *local_260;
  LhsScalar *local_258;
  LhsScalar *local_250;
  long local_248;
  long local_240;
  long actual_mc;
  long i2;
  long end;
  long start;
  long startTarget;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  double *l;
  double *r;
  double b;
  long s_1;
  long j;
  double a;
  long rs;
  long s;
  long i;
  long k;
  long local_1a0;
  long local_198;
  long actualPanelWidth;
  long k1;
  long local_180;
  long actual_cols;
  long j2;
  long local_168;
  long actual_kc;
  long k2;
  ulong local_150;
  ulong local_148;
  long subcols;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_128 [4];
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *blockW;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_d8 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeW;
  size_t sizeB;
  size_t sizeA;
  long local_98;
  long mc;
  long kc;
  blas_data_mapper<double,_long,_0> other;
  const_blas_data_mapper<double,_long,_0> tri;
  long cols;
  long otherStride_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_28;
  ulong local_20;
  
  ppdVar9 = local_358;
  otherSize_local = size;
  const_blas_data_mapper<double,_long,_0>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,_tri,triStride);
  blas_data_mapper<double,_long,_0>::blas_data_mapper
            ((blas_data_mapper<double,_long,_0> *)&kc,_other,otherStride);
  mc = level3_blocking<double,_double>::kc(blocking);
  sizeA = level3_blocking<double,_double>::mc(blocking);
  plVar7 = std::min<long>(&otherSize_local,(long *)&sizeA);
  lVar10 = mc;
  local_98 = *plVar7;
  size_00 = mc * local_98;
  size_01 = mc * otherSize;
  size_02 = mc * 8;
  local_20 = size_00;
  if (0x1fffffffffffffff < size_00) {
    throw_std_bad_alloc();
  }
  pLVar8 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar8 == (LhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      ppdVar9 = (double **)((long)local_358 - (size_00 * 8 + 0xf & 0xfffffffffffffff0));
      local_258 = (LhsScalar *)ppdVar9;
    }
    else {
      local_258 = (LhsScalar *)aligned_malloc(size_00 * 8);
    }
    local_250 = local_258;
  }
  else {
    local_250 = level3_blocking<double,_double>::blockA(blocking);
    ppdVar9 = local_358;
  }
  blockA_stack_memory_destructor._16_8_ = local_250;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x1570be;
  pLVar8 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar8 == (LhsScalar *)0x0) {
    local_260 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_260 = (double *)0x0;
  }
  pdVar11 = local_260;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x157113;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8,pdVar11,size_00,0x20000 < size_00 * 8)
  ;
  local_28 = size_01;
  if (0x1fffffffffffffff < size_01) {
    *(undefined8 *)((long)ppdVar9 + -8) = 0x157133;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)ppdVar9 + -8) = 0x157142;
  local_268 = level3_blocking<double,_double>::blockB(blocking);
  if (local_268 == (RhsScalar *)0x0) {
    if (size_01 * 8 < 0x20001) {
      ppdVar9 = (double **)((long)ppdVar9 + -(size_01 * 8 + 0xf & 0xfffffffffffffff0));
      local_280 = (RhsScalar *)ppdVar9;
    }
    else {
      *(undefined8 *)((long)ppdVar9 + -8) = 0x1571c2;
      local_288 = (RhsScalar *)aligned_malloc(size_01 * 8);
      local_280 = local_288;
    }
    local_278 = local_280;
  }
  else {
    *(undefined8 *)((long)ppdVar9 + -8) = 0x157161;
    local_278 = level3_blocking<double,_double>::blockB(blocking);
    local_270 = local_278;
  }
  blockB_stack_memory_destructor._16_8_ = local_278;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x157200;
  local_290 = level3_blocking<double,_double>::blockB(blocking);
  if (local_290 == (RhsScalar *)0x0) {
    local_298 = (double *)blockB_stack_memory_destructor._16_8_;
  }
  else {
    local_298 = (double *)0x0;
  }
  pdVar11 = local_298;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x15725e;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW,pdVar11,size_01,0x20000 < size_01 * 8);
  size_local = size_02;
  if (0x1fffffffffffffff < size_02) {
    *(undefined8 *)((long)ppdVar9 + -8) = 0x157280;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)ppdVar9 + -8) = 0x15728f;
  local_2a0 = level3_blocking<double,_double>::blockW(blocking);
  if (local_2a0 == (RhsScalar *)0x0) {
    if ((ulong)(lVar10 << 6) < 0x20001) {
      ppdVar9 = (double **)((long)ppdVar9 + lVar10 * -0x40);
      local_2b8 = (RhsScalar *)ppdVar9;
    }
    else {
      *(undefined8 *)((long)ppdVar9 + -8) = 0x15730f;
      local_2c0 = (RhsScalar *)aligned_malloc(lVar10 << 6);
      local_2b8 = local_2c0;
    }
    local_2b0 = local_2b8;
  }
  else {
    *(undefined8 *)((long)ppdVar9 + -8) = 0x1572ae;
    local_2b0 = level3_blocking<double,_double>::blockW(blocking);
    local_2a8 = local_2b0;
  }
  pRVar1 = local_2b0;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x15734d;
  local_2c8 = level3_blocking<double,_double>::blockW(blocking);
  if (local_2c8 == (RhsScalar *)0x0) {
    local_2d0 = pRVar1;
  }
  else {
    local_2d0 = (double *)0x0;
  }
  pdVar11 = local_2d0;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x1573ab;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128,pdVar11,size_02,
             0x20000 < (ulong)(lVar10 << 6));
  *(undefined8 *)((long)ppdVar9 + -8) = 0x1573c2;
  manage_caching_sizes(GetAction,&l2,&subcols);
  if (otherSize < 1) {
    local_2d8 = 0;
  }
  else {
    local_2d8 = (ulong)subcols / (ulong)(otherStride << 5);
  }
  local_148 = local_2d8;
  local_150 = local_2d8;
  if ((long)local_2d8 < 0) {
    local_150 = local_2d8 + 3;
  }
  local_150 = local_150 & 0xfffffffffffffffc;
  k2 = 4;
  *(undefined8 *)((long)ppdVar9 + -8) = 0x15743f;
  local_2e0 = (ulong *)std::max<long>((long *)&local_150,&k2);
  local_148 = *local_2e0;
  for (actual_kc = otherSize_local; 0 < actual_kc; actual_kc = actual_kc - mc) {
    j2 = actual_kc;
    *(undefined8 *)((long)ppdVar9 + -8) = 0x157493;
    plVar7 = std::min<long>(&j2,&mc);
    local_168 = *plVar7;
    for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_148 + actual_cols) {
      k1 = otherSize - actual_cols;
      *(undefined8 *)((long)ppdVar9 + -8) = 0x1574de;
      plVar7 = std::min<long>(&k1,(long *)&local_148);
      local_180 = *plVar7;
      for (actualPanelWidth = 0; actualPanelWidth < local_168;
          actualPanelWidth = actualPanelWidth + 4) {
        local_1a0 = local_168 - actualPanelWidth;
        k = 4;
        *(undefined8 *)((long)ppdVar9 + -8) = 0x15753a;
        plVar7 = std::min<long>(&local_1a0,&k);
        local_198 = *plVar7;
        for (i = 0; lVar10 = actual_cols, i < local_198; i = i + 1) {
          lVar10 = ~i + (actual_kc - actualPanelWidth);
          rs = lVar10 + 1;
          a = (double)(~i + local_198);
          s = lVar10;
          *(undefined8 *)((long)ppdVar9 + -8) = 0x1575c7;
          pdVar11 = const_blas_data_mapper<double,_long,_0>::operator()
                              ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar10,
                               lVar10);
          local_2e8 = pdVar11;
          *(undefined8 *)((long)ppdVar9 + -8) = 0x1575e3;
          local_2f0 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar11);
          j = (long)(1.0 / *local_2f0);
          for (s_1 = actual_cols; lVar12 = s, lVar10 = s_1, s_1 < actual_cols + local_180;
              s_1 = s_1 + 1) {
            b = (double)(s - (long)a);
            local_300 = (double)j;
            *(undefined8 *)((long)ppdVar9 + -8) = 0x157672;
            local_2f8 = blas_data_mapper<double,_long,_0>::operator()
                                  ((blas_data_mapper<double,_long,_0> *)&kc,lVar12,lVar10);
            lVar10 = s_1;
            dVar2 = b;
            r = (double *)(*local_2f8 * local_300);
            *local_2f8 = (double)r;
            *(undefined8 *)((long)ppdVar9 + -8) = 0x1576b5;
            local_308 = blas_data_mapper<double,_long,_0>::operator()
                                  ((blas_data_mapper<double,_long,_0> *)&kc,(long)dVar2,lVar10);
            lVar10 = s;
            dVar2 = b;
            l = local_308;
            *(undefined8 *)((long)ppdVar9 + -8) = 0x1576e3;
            local_310 = const_blas_data_mapper<double,_long,_0>::operator()
                                  ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,
                                   (long)dVar2,lVar10);
            i3 = (long)local_310;
            for (lengthTarget = 0; lengthTarget < (long)a; lengthTarget = lengthTarget + 1) {
              local_320 = r;
              pdVar11 = (double *)(i3 + lengthTarget * 8);
              *(undefined8 *)((long)ppdVar9 + -8) = 0x157747;
              local_318 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar11);
              l[lengthTarget] = -(double)local_320 * *local_318 + l[lengthTarget];
            }
          }
        }
        startTarget = (local_168 - actualPanelWidth) - local_198;
        lVar12 = (actual_kc - actualPanelWidth) - local_198;
        local_330 = (double *)(blockB_stack_memory_destructor._16_8_ + local_168 * actual_cols * 8);
        blockBOffset = lVar12;
        startBlock = startTarget;
        *(undefined8 *)((long)ppdVar9 + -8) = 0x1578ba;
        pdVar13 = blas_data_mapper<double,_long,_0>::operator()
                            ((blas_data_mapper<double,_long,_0> *)&kc,lVar12,lVar10);
        lVar3 = local_168;
        lVar12 = local_180;
        lVar10 = local_198;
        pdVar11 = local_330;
        local_328 = pdVar13;
        *(long *)((long)ppdVar9 + -8) = startTarget;
        *(long *)((long)ppdVar9 + -0x10) = lVar3;
        *(undefined8 *)((long)ppdVar9 + -0x18) = 0x15790b;
        gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                  ((gemm_pack_rhs<double,_long,_4,_0,_false,_true> *)((long)&l1 + 4),pdVar11,pdVar13
                   ,otherStride,lVar10,lVar12,*(long *)((long)ppdVar9 + -0x10),
                   *(long *)((long)ppdVar9 + -8));
        lVar10 = blockBOffset;
        if (0 < startBlock) {
          lVar12 = actual_kc - local_168;
          local_358[3] = (double *)blockA_stack_memory_destructor._16_8_;
          start = lVar12;
          *(undefined8 *)((long)ppdVar9 + -8) = 0x15795c;
          pdVar13 = const_blas_data_mapper<double,_long,_0>::operator()
                              ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar12,
                               lVar10);
          lVar12 = local_198;
          lVar10 = startBlock;
          pdVar11 = local_358[3];
          local_338 = pdVar13;
          *(undefined8 *)((long)ppdVar9 + -8) = 0;
          *(undefined8 *)((long)ppdVar9 + -0x10) = 0;
          *(undefined8 *)((long)ppdVar9 + -0x18) = 0x1579a7;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&l1 + 5),pdVar11,
                     pdVar13,triStride,lVar12,lVar10,*(long *)((long)ppdVar9 + -0x10),
                     *(long *)((long)ppdVar9 + -8));
          lVar12 = actual_cols;
          lVar10 = start;
          *(undefined8 *)((long)ppdVar9 + -8) = 0x1579c4;
          pdVar13 = blas_data_mapper<double,_long,_0>::operator()
                              ((blas_data_mapper<double,_long,_0> *)&kc,lVar10,lVar12);
          uVar6 = blockA_stack_memory_destructor._16_8_;
          lVar5 = local_168;
          lVar4 = local_180;
          lVar3 = local_198;
          lVar12 = startBlock;
          lVar10 = startTarget;
          local_358[2] = pdVar13;
          pdVar11 = (double *)(blockB_stack_memory_destructor._16_8_ + local_168 * actual_cols * 8);
          *(RhsScalar **)((long)ppdVar9 + -0x10) = pRVar1;
          *(long *)((long)ppdVar9 + -0x18) = lVar10;
          *(long *)((long)ppdVar9 + -0x28) = lVar5;
          *(long *)((long)ppdVar9 + -0x30) = lVar3;
          *(long *)((long)ppdVar9 + -0x38) = lVar4;
          *(long *)((long)ppdVar9 + -0x40) = lVar3;
          *(undefined8 *)((long)ppdVar9 + -0x20) = 0;
          *(undefined8 *)((long)ppdVar9 + -0x48) = 0x157a5c;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&l1 + 6),
                     pdVar13,otherStride,(double *)uVar6,pdVar11,lVar12,
                     *(long *)((long)ppdVar9 + -0x40),*(long *)((long)ppdVar9 + -0x38),-1.0,
                     *(long *)((long)ppdVar9 + -0x30),*(long *)((long)ppdVar9 + -0x28),
                     *(long *)((long)ppdVar9 + -0x20),*(long *)((long)ppdVar9 + -0x18),
                     *(double **)((long)ppdVar9 + -0x10));
        }
      }
    }
    end = 0;
    i2 = actual_kc - mc;
    for (actual_mc = 0; actual_mc < i2; actual_mc = local_98 + actual_mc) {
      local_248 = i2 - actual_mc;
      *(undefined8 *)((long)ppdVar9 + -8) = 0x157b03;
      plVar7 = std::min<long>(&local_98,&local_248);
      lVar10 = actual_mc;
      local_240 = *plVar7;
      if (0 < local_240) {
        local_358[0] = (double *)blockA_stack_memory_destructor._16_8_;
        lVar12 = actual_kc - mc;
        *(undefined8 *)((long)ppdVar9 + -8) = 0x157b4a;
        pdVar13 = const_blas_data_mapper<double,_long,_0>::operator()
                            ((const_blas_data_mapper<double,_long,_0> *)&other.m_stride,lVar10,
                             lVar12);
        lVar12 = local_168;
        lVar10 = local_240;
        pdVar11 = local_358[0];
        local_358[1] = pdVar13;
        *(undefined8 *)((long)ppdVar9 + -8) = 0;
        *(undefined8 *)((long)ppdVar9 + -0x10) = 0;
        *(undefined8 *)((long)ppdVar9 + -0x18) = 0x157b95;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                  ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&l1 + 5),pdVar11,
                   pdVar13,triStride,lVar12,lVar10,*(long *)((long)ppdVar9 + -0x10),
                   *(long *)((long)ppdVar9 + -8));
        blockA_00 = blockA_stack_memory_destructor._16_8_;
        uVar6 = blockB_stack_memory_destructor._16_8_;
        lVar12 = local_168;
        lVar10 = local_240;
        res = _other + actual_mc;
        *(RhsScalar **)((long)ppdVar9 + -0x10) = pRVar1;
        *(long *)((long)ppdVar9 + -0x38) = otherSize;
        *(long *)((long)ppdVar9 + -0x40) = lVar12;
        *(undefined8 *)((long)ppdVar9 + -0x18) = 0;
        *(undefined8 *)((long)ppdVar9 + -0x20) = 0;
        *(undefined8 *)((long)ppdVar9 + -0x28) = 0xffffffffffffffff;
        *(undefined8 *)((long)ppdVar9 + -0x30) = 0xffffffffffffffff;
        *(undefined8 *)((long)ppdVar9 + -0x48) = 0x157c1b;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&l1 + 6),res,
                   otherStride,(double *)blockA_00,(double *)uVar6,lVar10,
                   *(long *)((long)ppdVar9 + -0x40),*(long *)((long)ppdVar9 + -0x38),-1.0,
                   *(long *)((long)ppdVar9 + -0x30),*(long *)((long)ppdVar9 + -0x28),
                   *(long *)((long)ppdVar9 + -0x20),*(long *)((long)ppdVar9 + -0x18),
                   *(double **)((long)ppdVar9 + -0x10));
      }
    }
  }
  *(undefined8 *)((long)ppdVar9 + -8) = 0x157c6a;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128);
  *(undefined8 *)((long)ppdVar9 + -8) = 0x157c76;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW);
  *(undefined8 *)((long)ppdVar9 + -8) = 0x157c82;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * otherStride) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index s  = IsLower ? k2+k1 : i+1;
            Index rs = actualPanelWidth - k - 1; // remaining size

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Index s = IsLower ? i+1 : i-rs;
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }